

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.cpp
# Opt level: O0

int modrf_pos(int ord,double *coef,double a,double b,double *val,int invert)

{
  double *pdVar1;
  int in_ECX;
  double *in_RDX;
  double *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double x;
  double temp;
  double fb;
  double fa;
  double *ecoef;
  double *scoef;
  double *fp;
  double lfx;
  double fx;
  int its;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_68;
  double local_60;
  double *local_48;
  double local_40;
  double local_38;
  int local_30;
  double local_20;
  double local_18;
  int local_4;
  
  pdVar1 = in_RSI + in_EDI;
  if (in_ECX == 0) {
    local_68 = *pdVar1;
    local_60 = local_68;
    local_48 = pdVar1;
    while (local_48 = local_48 + -1, local_80 = in_XMM0_Qa, local_88 = in_XMM1_Qa,
          in_RSI <= local_48) {
      local_60 = in_XMM0_Qa * local_60 + *local_48;
      local_68 = in_XMM1_Qa * local_68 + *local_48;
    }
  }
  else {
    local_80 = 1.0 / in_XMM1_Qa;
    local_88 = 1.0 / in_XMM0_Qa;
    local_68 = *in_RSI;
    local_60 = local_68;
    for (local_48 = in_RSI + 1; local_48 <= pdVar1; local_48 = local_48 + 1) {
      local_60 = local_80 * local_60 + *local_48;
      local_68 = local_88 * local_68 + *local_48;
    }
  }
  if (local_60 * local_68 <= 0.0) {
    if (1e-12 <= ABS(local_60)) {
      if (1e-12 <= ABS(local_68)) {
        local_40 = local_60;
        local_20 = local_88;
        local_18 = local_80;
        for (local_30 = 0; local_30 < 800; local_30 = local_30 + 1) {
          local_98 = (local_68 * local_18 + -(local_60 * local_20)) / (local_68 - local_60);
          if (in_ECX == 0) {
            local_38 = *pdVar1;
            local_48 = pdVar1;
            while (local_48 = local_48 + -1, in_RSI <= local_48) {
              local_38 = local_98 * local_38 + *local_48;
            }
          }
          else {
            local_38 = *in_RSI;
            for (local_48 = in_RSI + 1; local_48 <= pdVar1; local_48 = local_48 + 1) {
              local_38 = local_98 * local_38 + *local_48;
            }
          }
          if ((1e-12 < ABS(local_98)) && (ABS(local_38 / local_98) < 1e-12)) {
            local_90 = local_98;
            if (in_ECX != 0) {
              local_90 = 1.0 / local_98;
            }
            *in_RDX = local_90;
            return 1;
          }
          if (ABS(local_38) < 1e-12) {
            if (in_ECX != 0) {
              local_98 = 1.0 / local_98;
            }
            *in_RDX = local_98;
            return 1;
          }
          if (0.0 <= local_60 * local_38) {
            local_60 = local_38;
            local_18 = local_98;
            if (0.0 < local_40 * local_38) {
              local_68 = local_68 / 2.0;
            }
          }
          else {
            local_68 = local_38;
            local_20 = local_98;
            if (0.0 < local_40 * local_38) {
              local_60 = local_60 / 2.0;
            }
          }
          if (ABS(local_20 - local_18) < ABS(local_18 * 1e-12)) {
            if (in_ECX == 0) {
              local_a0 = local_18;
            }
            else {
              local_a0 = 1.0 / local_18;
            }
            *in_RDX = local_a0;
            return 1;
          }
          local_40 = local_38;
        }
        fprintf(_stderr,"modrf overflow on interval %f %f\n",local_18,local_20);
        fprintf(_stderr,"\t b-a = %12.5e\n",local_20 - local_18);
        fprintf(_stderr,"\t fa  = %12.5e\n",local_60);
        fprintf(_stderr,"\t fb  = %12.5e\n",local_68);
        fprintf(_stderr,"\t fx  = %12.5e\n",local_38);
        if (in_ECX == 0) {
          local_68 = *pdVar1;
          local_60 = local_68;
          local_48 = pdVar1;
          while (local_48 = local_48 + -1, in_RSI <= local_48) {
            local_60 = local_18 * local_60 + *local_48;
            local_68 = local_20 * local_68 + *local_48;
          }
        }
        else {
          local_68 = *in_RSI;
          local_60 = local_68;
          for (local_48 = in_RSI + 1; local_48 <= pdVar1; local_48 = local_48 + 1) {
            local_60 = local_18 * local_60 + *local_48;
            local_68 = local_20 * local_68 + *local_48;
          }
        }
        fprintf(_stderr,"\t true fa = %12.5e\n",local_60);
        fprintf(_stderr,"\t true fb = %12.5e\n",local_68);
        fprintf(_stderr,"\t gradient= %12.5e\n",(local_68 - local_60) / (local_20 - local_18));
        fprintf(_stderr,"Polynomial coefficients\n");
        for (local_48 = pdVar1; in_RSI <= local_48; local_48 = local_48 + -1) {
          fprintf(_stderr,"\t%12.5e\n",*local_48);
        }
        local_4 = 0;
      }
      else {
        if (in_ECX != 0) {
          local_88 = 1.0 / local_88;
        }
        *in_RDX = local_88;
        local_4 = 1;
      }
    }
    else {
      if (in_ECX != 0) {
        local_80 = 1.0 / local_80;
      }
      *in_RDX = local_80;
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int modrf_pos( int ord, double *coef, double a, double b, 
	double *val, int invert)
   {
   int  its;
   double fx, lfx;
   double *fp;
   double *scoef = coef;
   double *ecoef = &coef[ord];
   double fa, fb;

   // Invert the interval if required
   if (invert)
      {
      double temp = a;
      a = 1.0 / b;
      b = 1.0 / temp;
      }

   // Evaluate the polynomial at the end points
   if (invert)
      {
      fb = fa = *scoef;
      for (fp = scoef + 1; fp <= ecoef; fp++) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }
   else
      {
      fb = fa = *ecoef;
      for (fp = ecoef - 1; fp >= scoef; fp--) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }

   // if there is no sign difference the method won't work
   if (fa * fb > 0.0)
      return(0);

   // Return if the values are close to zero already
   if (fabs(fa) < RELERROR) 
      {
      *val = invert ? 1.0/a : a;
      return(1);
      }

   if (fabs(fb) < RELERROR) 
      {
      *val = invert ? 1.0/b : b;
      return(1);
      }

   lfx = fa;

   for (its = 0; its < MAXIT; its++) 
      {
      // Assuming straight line from a to b, find zero
      double x = (fb * a - fa * b) / (fb - fa);

      // Evaluate the polynomial at x
      if (invert)
         {
         fx = *scoef;
         for (fp = scoef + 1; fp <= ecoef; fp++)
            fx = x * fx + *fp;
	 }
      else
         {
         fx = *ecoef;
         for (fp = ecoef - 1; fp >= scoef; fp--)
            fx = x * fx + *fp;
         }

      // Evaluate two stopping conditions
      if (fabs(x) > RELERROR && fabs(fx/x) < RELERROR) 
         {
         *val = invert ? 1.0/x : x;
         return(1);
         }
      else if (fabs(fx) < RELERROR) 
         {
         *val = invert ? 1.0/x : x;
         return(1);
         }

      // Subdivide region, depending on whether fx has same sign as fa or fb
      if ((fa * fx) < 0) 
         {
         b = x;
         fb = fx;
         if ((lfx * fx) > 0)
            fa /= 2;
         } 
      else 
         {
         a = x;
         fa = fx;
         if ((lfx * fx) > 0)
            fb /= 2;
         }

   
      // Return if the difference between a and b is very small
      if (fabs(b-a) < fabs(RELERROR * a))
         {
         *val = invert ? 1.0/a : a;
         return(1);
         }

      lfx = fx;
      }

   //==================================================================
   // This is debugging in case something goes wrong.
   // If we reach here, we have not converged -- give some diagnostics
   //==================================================================

   fprintf(stderr, "modrf overflow on interval %f %f\n", a, b);
   fprintf(stderr, "\t b-a = %12.5e\n", b-a);
   fprintf(stderr, "\t fa  = %12.5e\n", fa);
   fprintf(stderr, "\t fb  = %12.5e\n", fb);
   fprintf(stderr, "\t fx  = %12.5e\n", fx);

   // Evaluate the true values at a and b
   if (invert)
      {
      fb = fa = *scoef;
      for (fp = scoef + 1; fp <= ecoef; fp++)
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }
   else
      {
      fb = fa = *ecoef;
      for (fp = ecoef - 1; fp >= scoef; fp--) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }

   fprintf(stderr, "\t true fa = %12.5e\n", fa);
   fprintf(stderr, "\t true fb = %12.5e\n", fb);
   fprintf(stderr, "\t gradient= %12.5e\n", (fb-fa)/(b-a));

   // Print out the polynomial
   fprintf(stderr, "Polynomial coefficients\n");
   for (fp = ecoef; fp >= scoef; fp--) 
      fprintf (stderr, "\t%12.5e\n", *fp);

   return(0);
   }